

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  ZSTD_allocFunction p_Var1;
  void *pvVar2;
  ZSTD_freeFunction p_Var3;
  ZSTD_DDict **__ptr;
  ZSTD_DDictHashSet *hashSet;
  ZSTD_DDict **ppZVar4;
  size_t sVar5;
  ulong uVar6;
  size_t __size;
  ulong uVar7;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  if (ddict == (ZSTD_DDict *)0x0) {
    return 0;
  }
  dctx->ddict = ddict;
  dctx->dictUses = ZSTD_use_indefinitely;
  if (dctx->refMultipleDDicts != ZSTD_rmd_refMultipleDDicts) {
    return 0;
  }
  hashSet = dctx->ddictSet;
  if (hashSet == (ZSTD_DDictHashSet *)0x0) {
    p_Var1 = (dctx->customMem).customAlloc;
    pvVar2 = (dctx->customMem).opaque;
    if (p_Var1 == (ZSTD_allocFunction)0x0) {
      p_Var3 = (dctx->customMem).customFree;
      hashSet = (ZSTD_DDictHashSet *)malloc(0x18);
      if (hashSet == (ZSTD_DDictHashSet *)0x0) {
LAB_0017dfcb:
        dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
        return 0xffffffffffffffc0;
      }
      ppZVar4 = (ZSTD_DDict **)calloc(1,0x200);
      hashSet->ddictPtrTable = ppZVar4;
      if (ppZVar4 == (ZSTD_DDict **)0x0) {
        if (p_Var3 == (ZSTD_freeFunction)0x0) {
          free(hashSet);
        }
        else {
          (*p_Var3)(pvVar2,hashSet);
        }
        goto LAB_0017dfcb;
      }
    }
    else {
      hashSet = (ZSTD_DDictHashSet *)(*p_Var1)(pvVar2,0x18);
      if (hashSet == (ZSTD_DDictHashSet *)0x0) goto LAB_0017dfcb;
      ppZVar4 = (ZSTD_DDict **)(*p_Var1)(pvVar2,0x200);
      memset(ppZVar4,0,0x200);
      hashSet->ddictPtrTable = ppZVar4;
    }
    hashSet->ddictPtrTableSize = 0x40;
    hashSet->ddictPtrCount = 0;
    dctx->ddictSet = hashSet;
  }
  if (dctx->staticSize != 0) {
    __assert_fail("!dctx->staticSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa231,"size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *, const ZSTD_DDict *)");
  }
  uVar7 = hashSet->ddictPtrTableSize;
  if (uVar7 <= hashSet->ddictPtrCount << 2) {
    p_Var1 = (dctx->customMem).customAlloc;
    p_Var3 = (dctx->customMem).customFree;
    pvVar2 = (dctx->customMem).opaque;
    __size = uVar7 << 4;
    if (p_Var1 == (ZSTD_allocFunction)0x0) {
      ppZVar4 = (ZSTD_DDict **)calloc(1,__size);
      uVar6 = uVar7;
    }
    else {
      ppZVar4 = (ZSTD_DDict **)(*p_Var1)(pvVar2,__size);
      memset(ppZVar4,0,__size);
      uVar6 = hashSet->ddictPtrTableSize;
    }
    if (ppZVar4 == (ZSTD_DDict **)0x0) {
      return 0xffffffffffffffc0;
    }
    __ptr = hashSet->ddictPtrTable;
    hashSet->ddictPtrTable = ppZVar4;
    hashSet->ddictPtrTableSize = uVar7 * 2;
    hashSet->ddictPtrCount = 0;
    if (uVar6 == 0) {
      if (__ptr == (ZSTD_DDict **)0x0) goto LAB_0017deb6;
    }
    else {
      uVar7 = 0;
      do {
        if ((__ptr[uVar7] != (ZSTD_DDict *)0x0) &&
           (sVar5 = ZSTD_DDictHashSet_emplaceDDict(hashSet,__ptr[uVar7]), 0xffffffffffffff88 < sVar5
           )) {
          return 0xffffffffffffffff;
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    if (p_Var3 == (ZSTD_freeFunction)0x0) {
      free(__ptr);
    }
    else {
      (*p_Var3)(pvVar2,__ptr);
    }
  }
LAB_0017deb6:
  sVar5 = ZSTD_DDictHashSet_emplaceDDict(hashSet,ddict);
  if (sVar5 < 0xffffffffffffff89) {
    return 0;
  }
  return sVar5;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}